

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints_with_arguments.cpp
# Opt level: O2

bool __thiscall Part_Key_Store_Data::operator==(Part_Key_Store_Data *this,Am_Wrapper *test_value)

{
  uint uVar1;
  undefined4 uVar2;
  Am_ID_Tag AVar3;
  int iVar4;
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  
  AVar3 = id;
  iVar4 = (**(test_value->super_Am_Registered_Type)._vptr_Am_Registered_Type)(test_value);
  if (AVar3 == (Am_ID_Tag)iVar4) {
    if (test_value == &this->super_Am_Wrapper) {
      bVar5 = true;
    }
    else {
      uVar1 = *(uint *)&test_value->field_0xc;
      uVar2 = *(undefined4 *)&(this->super_Am_Wrapper).field_0xc;
      auVar6._0_2_ = -(ushort)((short)uVar2 == (short)uVar1);
      auVar6._2_2_ = -(ushort)((short)((uint)uVar2 >> 0x10) == (short)(uVar1 >> 0x10));
      auVar6._4_2_ = 0xffff;
      auVar6._6_2_ = 0xffff;
      auVar6._8_2_ = 0xffff;
      auVar6._10_2_ = 0xffff;
      auVar6._12_2_ = 0xffff;
      auVar6._14_2_ = 0xffff;
      auVar6 = pshuflw(ZEXT416(uVar1),auVar6,0x50);
      auVar7._0_4_ = auVar6._0_4_;
      auVar7._4_4_ = auVar7._0_4_;
      auVar7._8_4_ = auVar6._4_4_;
      auVar7._12_4_ = auVar6._4_4_;
      iVar4 = movmskpd(iVar4,auVar7);
      bVar5 = iVar4 == 3;
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

static Am_Value
from_part_procedure(Am_Object &self)
{
  Am_Value value;
  Part_Key_Store_Data *store =
      (Part_Key_Store_Data *)Am_Object_Advanced::Get_Context()->Get_Data();
  value = self.Get_Object(store->part).Get(store->key);
  store->Release();
  return value;
}